

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Texture.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmGen11TextureCalc::GetMipTailGeometryOffset
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  uint32_t uVar1;
  uint32_t uVar2;
  anon_struct_8_44_94931171_for_Info aVar3;
  uint uVar4;
  GMM_MIPTAIL_SLOT_OFFSET (*paGVar5) [5];
  uint uVar6;
  long lVar7;
  
  uVar1 = pTexInfo->BitsPerPixel;
  uVar6 = uVar1 << 0x1d | uVar1 - 8 >> 3;
  if (uVar6 < 8) {
    lVar7 = *(long *)(&DAT_001c84a0 + (ulong)uVar6 * 8);
  }
  else {
    lVar7 = 0;
  }
  switch(pTexInfo->Type) {
  case RESOURCE_1D:
    uVar6 = MipLevel - (pTexInfo->Alignment).MipTailStartLod;
    paGVar5 = Gen11MipTailSlotOffset1DSurface;
    break;
  case RESOURCE_2D:
  case RESOURCE_CUBE:
    aVar3 = (pTexInfo->Flags).Info;
    if (((ulong)aVar3 >> 0x26 & 1) == 0) {
      if (((ulong)aVar3 >> 0x25 & 1) != 0) {
        uVar4 = (pTexInfo->MSAA).NumSamples - 2;
        uVar6 = uVar4 >> 1;
        uVar4 = uVar6 | (uint)((uVar4 & 1) != 0) << 0x1f;
        if ((uVar4 < 8) && ((0x8bU >> (uVar6 & 0x1f) & 1) != 0)) {
          uVar6 = *(uint *)(&DAT_001c8290 + (ulong)uVar4 * 4);
          goto LAB_001b3b0b;
        }
      }
      uVar6 = aVar3._4_4_ >> 3 & 4;
    }
    else {
      uVar2 = (pTexInfo->MSAA).NumSamples;
      if (uVar2 == 4) {
        uVar6 = 2;
      }
      else if (uVar2 == 8) {
        uVar6 = 3;
      }
      else if (uVar2 == 0x10) {
        uVar6 = 4;
      }
      else {
        uVar6 = (uint)(uVar2 == 2);
      }
    }
LAB_001b3b0b:
    uVar6 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + uVar6;
    paGVar5 = Gen11MipTailSlotOffset2DSurface;
    break;
  case RESOURCE_3D:
    uVar6 = MipLevel - (pTexInfo->Alignment).MipTailStartLod;
    paGVar5 = Gen11MipTailSlotOffset3DSurface;
    break;
  default:
    goto switchD_001b3a75_default;
  }
  *OffsetX = uVar1 * paGVar5[uVar6][lVar7].X >> 3;
  *OffsetY = paGVar5[uVar6][lVar7].Y;
  *OffsetZ = paGVar5[uVar6][lVar7].Z;
switchD_001b3a75_default:
  return;
}

Assistant:

void GmmLib::GmmGen11TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel,
                                                           uint32_t *        OffsetX,
                                                           uint32_t *        OffsetY,
                                                           uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod;

        *OffsetX = Gen11MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen11MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen11MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               // TileYs
               ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 8) ? 3 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 4) ? 2 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 2) ? 1 :
               (pTexInfo->Flags.Info.TiledYs) ? 0 :
               // TileYf
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 16) ? 11 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 8) ? 10 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 4) ? 8 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 2) ? 5 :
               (pTexInfo->Flags.Info.TiledYf) ? 4 : 0);
        // clang-format on

        *OffsetX = Gen11MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen11MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen11MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_3D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod;

        *OffsetX = Gen11MipTailSlotOffset3DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen11MipTailSlotOffset3DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen11MipTailSlotOffset3DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}